

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constructor.cpp
# Opt level: O3

Constructor * __thiscall cppgenerate::Constructor::operator=(Constructor *this,Constructor *other)

{
  list<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_> *this_00;
  
  if (this != other) {
    std::__cxx11::string::_M_assign((string *)this);
    this_00 = &this->m_arguments;
    std::__cxx11::_List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>::
    _M_clear(&this_00->
              super__List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>);
    (this->m_arguments).
    super__List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>._M_impl._M_node.
    super__List_node_base._M_prev = (_List_node_base *)this_00;
    (this->m_arguments).
    super__List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>._M_impl._M_node.
    super__List_node_base._M_next = (_List_node_base *)this_00;
    (this->m_arguments).
    super__List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>._M_impl._M_node.
    _M_size = 0;
    std::__cxx11::list<cppgenerate::Argument,std::allocator<cppgenerate::Argument>>::
    _M_assign_dispatch<std::_List_const_iterator<cppgenerate::Argument>>
              ((list<cppgenerate::Argument,std::allocator<cppgenerate::Argument>> *)this_00,
               (other->m_arguments).
               super__List_base<cppgenerate::Argument,_std::allocator<cppgenerate::Argument>_>.
               _M_impl._M_node.super__List_node_base._M_next,&other->m_arguments);
    CodeBlock::operator=(&this->m_code,&other->m_code);
    this->m_accessModifier = other->m_accessModifier;
  }
  return this;
}

Assistant:

Constructor& Constructor::operator=( const Constructor& other ){
    if( this != &other ){
        m_documentation = other.m_documentation;
        m_arguments.clear();
        m_arguments = other.m_arguments;
        m_code = other.m_code;
        m_accessModifier = other.m_accessModifier;
    }

    return *this;
}